

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compute_branch_nm
               (DisasContext_conflict6 *ctx,uint32_t opc,int insn_bytes,int rs,int rt,int32_t offset
               )

{
  target_ulong *ptVar1;
  byte *pbVar2;
  TCGContext_conflict6 *tcg_ctx;
  bool bVar3;
  TCGCond cond;
  TCGv_i64 ret;
  TCGv_i64 arg2;
  TCGv_i64 pTVar4;
  target_ulong tVar5;
  uintptr_t o;
  uint uVar6;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  arg2 = tcg_temp_new_i64(tcg_ctx);
  if (opc - 8 < 2) {
    if ((offset & 0xffffffefU) != 0) {
LAB_00870e7f:
      generate_exception_end(ctx,0x14);
      goto LAB_00870f83;
    }
    gen_load_gpr(tcg_ctx,tcg_ctx->btarget,rs);
    tVar5 = 0xffffffffffffffff;
LAB_00870dfc:
    if (opc == 8) {
      uVar6 = 0x2000;
    }
    else if (opc == 9) {
      uVar6 = 0x2000;
      if (0 < rt) {
        pTVar4 = tcg_ctx->cpu_gpr[(uint)rt];
        uVar6 = 0x2000;
LAB_00870eec:
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar4,(ulong)(uint)insn_bytes + (ctx->base).pc_next);
      }
    }
    else {
      if (opc == 0x14000000) {
        tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[0x1f],(ctx->base).pc_next + 8);
        ptVar1 = &(ctx->base).pc_next;
        *ptVar1 = *ptVar1 + 4;
        goto LAB_00870f83;
      }
      uVar6 = 0x800;
      if (opc != 0x10000000) {
        if (opc != 0x4110000) goto LAB_00870e7f;
        pTVar4 = tcg_ctx->cpu_gpr[0x1f];
        uVar6 = 0x800;
        goto LAB_00870eec;
      }
    }
  }
  else {
    if (opc == 0x4110000) {
      pTVar4 = ret;
      if (rs == 0) {
        bVar3 = true;
      }
      else {
LAB_00870de2:
        gen_load_gpr(tcg_ctx,pTVar4,rs);
        bVar3 = false;
      }
LAB_00870de9:
      tVar5 = (long)offset + (ulong)(uint)insn_bytes + (ctx->base).pc_next;
      if (bVar3) goto LAB_00870dfc;
      if (opc == 0x4110000) {
        tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_GE,tcg_ctx->bcond,ret,0);
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx,tcg_ctx->cpu_gpr[0x1f],(ulong)(uint)insn_bytes + (ctx->base).pc_next);
      }
      else {
        if (opc == 0x41c0000) goto LAB_00870eb2;
        if (opc == 0x14000000) {
          pTVar4 = tcg_ctx->bcond;
          cond = TCG_COND_NE;
        }
        else {
          if (opc != 0x10000000) goto LAB_00870e7f;
          pTVar4 = tcg_ctx->bcond;
          cond = TCG_COND_EQ;
        }
        tcg_gen_setcond_i64_mips64el(tcg_ctx,cond,pTVar4,ret,arg2);
      }
    }
    else {
      if (opc != 0x41c0000) {
        if ((opc != 0x14000000) && (opc != 0x10000000)) goto LAB_00870e7f;
        bVar3 = true;
        if (rs != rt) {
          gen_load_gpr(tcg_ctx,ret,rs);
          pTVar4 = arg2;
          rs = rt;
          goto LAB_00870de2;
        }
        goto LAB_00870de9;
      }
      tcg_gen_andi_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_dspctrl,0x3f);
      tVar5 = (long)offset + (ulong)(uint)insn_bytes + (ctx->base).pc_next;
LAB_00870eb2:
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_GE,tcg_ctx->bcond,ret,0x20);
    }
    uVar6 = 0x1000;
  }
  ctx->hflags = ctx->hflags | uVar6;
  ctx->btarget = tVar5;
LAB_00870f83:
  if (insn_bytes == 2) {
    pbVar2 = (byte *)((long)&ctx->hflags + 1);
    *pbVar2 = *pbVar2 | 0x40;
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_compute_branch_nm(DisasContext *ctx, uint32_t opc,
                                int insn_bytes,
                                int rs, int rt, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btgt = -1;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    /* Load needed operands */
    switch (opc) {
    case OPC_BEQ:
    case OPC_BNE:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BGEZAL:
        /* Compare to zero */
        if (rs != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BPOSGE32:
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x3F);
        bcond_compute = 1;
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_JR:
    case OPC_JALR:
        /* Jump to register */
        if (offset != 0 && offset != 16) {
            /*
             * Hint = 0 is JR/JALR, hint 16 is JR.HB/JALR.HB, the
             * others are reserved.
             */
            MIPS_INVAL("jump hint");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
        gen_load_gpr(tcg_ctx, tcg_ctx->btarget, rs);
        break;
    default:
        MIPS_INVAL("branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    if (bcond_compute == 0) {
        /* No condition to be computed */
        switch (opc) {
        case OPC_BEQ:     /* rx == rx        */
            /* Always take */
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BGEZAL:  /* 0 >= 0          */
            /* Always take and link */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31],
                            ctx->base.pc_next + insn_bytes);
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BNE:     /* rx != rx        */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 8);
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_JR:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_JALR:
            if (rt > 0) {
                tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt],
                                ctx->base.pc_next + insn_bytes);
            }
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        default:
            MIPS_INVAL("branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    } else {
        switch (opc) {
        case OPC_BEQ:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BNE:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BGEZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31],
                            ctx->base.pc_next + insn_bytes);
            goto not_likely;
        case OPC_BPOSGE32:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 32);
        not_likely:
            ctx->hflags |= MIPS_HFLAG_BC;
            break;
        default:
            MIPS_INVAL("conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    }

    ctx->btarget = btgt;

 out:
    if (insn_bytes == 2) {
        ctx->hflags |= MIPS_HFLAG_B16;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}